

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

void connection_close_cb(uv_handle_t *handle)

{
  int *piVar1;
  long *plVar2;
  int64_t eval_b;
  int64_t eval_a;
  long local_8;
  
  plVar2 = (long *)handle->data;
  piVar1 = (int *)((long)plVar2 + 0x114);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (test_mode == '\x01') {
    if ((int)plVar2[0x22] != 0) {
      local_8 = plVar2[0x20];
      if (local_8 == 0x10000) {
        local_8 = plVar2[0x21];
        if (local_8 == 0) goto LAB_001b3259;
        plVar2 = &local_8;
        connection_close_cb_cold_2();
        goto LAB_001b31e7;
      }
      goto LAB_001b3208;
    }
LAB_001b3217:
    local_8 = plVar2[0x20];
    if (local_8 != 0) goto LAB_001b3277;
  }
  else {
LAB_001b31e7:
    local_8 = plVar2[0x20];
    if (local_8 != 0x10000) {
LAB_001b3208:
      plVar2 = &local_8;
      connection_close_cb_cold_1();
      goto LAB_001b3217;
    }
  }
  local_8 = plVar2[0x21];
  if (local_8 == 0x10000) {
LAB_001b3259:
    closed_connections = closed_connections + 1;
    free(plVar2);
    return;
  }
  connection_close_cb_cold_4();
LAB_001b3277:
  plVar2 = &local_8;
  connection_close_cb_cold_3();
  free((void *)*plVar2);
  return;
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT_EQ(context->read, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->read);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT_EQ(context->sent, TRANSFER_BYTES);
    } else {
      ASSERT_OK(context->sent);
    }

    closed_connections++;

    free(context);
  }
}